

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O2

grid_split * idx2::Split(grid_split *__return_storage_ptr__,grid *Grid,dimension D,int N)

{
  int *piVar1;
  u64 uVar2;
  long lVar3;
  v3i Mask3;
  ulong local_48;
  uint local_40;
  ulong local_38;
  uint local_30;
  ulong local_28;
  uint local_20;
  ulong local_18;
  int local_10;
  
  uVar2 = (Grid->super_extent).Dims;
  local_48 = (long)(uVar2 << 0x16) >> 0xb & 0xffffffff00000000U |
             (ulong)(uint)((long)(uVar2 << 0x2b) >> 0x2b);
  local_28 = local_48;
  local_40 = (uint)((long)(uVar2 * 2) >> 0x2b);
  local_20 = local_40;
  (__return_storage_ptr__->First).Strd = Grid->Strd;
  uVar2 = (Grid->super_extent).Dims;
  (__return_storage_ptr__->First).super_extent.From = (Grid->super_extent).From;
  (__return_storage_ptr__->First).super_extent.Dims = uVar2;
  (__return_storage_ptr__->Second).Strd = Grid->Strd;
  uVar2 = (Grid->super_extent).Dims;
  (__return_storage_ptr__->Second).super_extent.From = (Grid->super_extent).From;
  (__return_storage_ptr__->Second).super_extent.Dims = uVar2;
  if ((int)D < 3) {
    lVar3 = (long)(int)D;
    *(int *)((long)&local_48 + lVar3 * 4) = N;
    (__return_storage_ptr__->First).super_extent.Dims =
         (ulong)(local_40 & 0x1fffff) << 0x2a |
         (local_48 >> 0x20 & 0x1fffff) << 0x15 | local_48 & 0x1fffff;
    *(int *)((long)&local_48 + lVar3 * 4) = *(int *)((long)&local_28 + lVar3 * 4) - N;
    (__return_storage_ptr__->Second).super_extent.Dims =
         (ulong)(local_40 & 0x1fffff) << 0x2a |
         (local_48 >> 0x20 & 0x1fffff) << 0x15 | local_48 & 0x1fffff;
    uVar2 = (Grid->super_extent).From;
    local_38 = (long)(uVar2 << 0x16) >> 0xb & 0xffffffff00000000U |
               (ulong)(uint)((long)(uVar2 << 0x2b) >> 0x2b);
    local_30 = (uint)((long)(uVar2 * 2) >> 0x2b);
    uVar2 = Grid->Strd;
    local_18 = (long)(uVar2 << 0x16) >> 0xb & 0xffffffff00000000U |
               (ulong)(uint)((long)(uVar2 << 0x2b) >> 0x2b);
    local_10 = (int)((long)(uVar2 * 2) >> 0x2b);
    piVar1 = (int *)((long)&local_38 + lVar3 * 4);
    *piVar1 = *piVar1 + N * *(int *)((long)&local_18 + lVar3 * 4);
    (__return_storage_ptr__->Second).super_extent.From =
         (ulong)(local_30 & 0x1fffff) << 0x2a |
         (local_38 >> 0x20 & 0x1fffff) << 0x15 | local_38 & 0x1fffff;
    return __return_storage_ptr__;
  }
  __assert_fail("Idx < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
}

Assistant:

grid_split
Split(const grid& Grid, dimension D, int N)
{
  v3i Dims3 = Dims(Grid);
  idx2_Assert(N <= Dims3[D] && N >= 0);
  grid_split GridSplit{ Grid, Grid };
  v3i Mask3 = Dims3;
  Mask3[D] = N;
  SetDims(&GridSplit.First, Mask3);
  Mask3[D] = Dims3[D] - N;
  SetDims(&GridSplit.Second, Mask3);
  v3i From3 = From(Grid);
  From3[D] += N * Strd(Grid)[D];
  SetFrom(&GridSplit.Second, From3);
  return GridSplit;
}